

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receiver_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Receiver_PDU::Encode(Receiver_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Receiver_PDU *this_local;
  
  Radio_Communications_Header::Encode(&this->super_Radio_Communications_Header,stream);
  pKVar1 = KDataStream::operator<<
                     (stream,*(unsigned_short *)
                              &(this->super_Radio_Communications_Header).field_0x3a);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,*(unsigned_short *)
                              &(this->super_Radio_Communications_Header).field_0x3c);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32RecPwr);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_TransmitterEntityID);
  KDataStream::operator<<(pKVar1,this->m_ui16TransmitterRadioID);
  return;
}

Assistant:

void Receiver_PDU::Encode( KDataStream & stream ) const
{
    Radio_Communications_Header::Encode( stream );

    stream << m_ui16ReceiverState
           << m_ui16Padding1
           << m_f32RecPwr
           << KDIS_STREAM m_TransmitterEntityID
           << m_ui16TransmitterRadioID;
}